

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_impl.cc
# Opt level: O2

int32_t __thiscall webrtc::TraceImpl::AddLevel(TraceImpl *this,char *sz_message,TraceLevel level)

{
  undefined8 uVar1;
  
  switch(level) {
  case kTraceStateInfo:
    builtin_strncpy(sz_message + 5,"INFO ; ",8);
    uVar1 = 0x464e494554415453;
    break;
  case kTraceWarning:
    builtin_strncpy(sz_message + 5,"NG   ; ",8);
    uVar1 = 0x20474e494e524157;
    break;
  case kTraceWarning|kTraceStateInfo:
  case kTraceError|kTraceStateInfo:
  case kTraceError|kTraceWarning:
  case kTraceError|kTraceWarning|kTraceStateInfo:
switchD_0018f8a1_caseD_2:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/system_wrappers/source/trace_impl.cc"
                  ,0x7f,"int32_t webrtc::TraceImpl::AddLevel(char *, const TraceLevel) const");
  case kTraceError:
    builtin_strncpy(sz_message + 5,"     ; ",8);
    uVar1 = 0x202020524f525245;
    break;
  case kTraceCritical:
    builtin_strncpy(sz_message + 5,"CAL  ; ",8);
    uVar1 = 0x4c41434954495243;
    break;
  default:
    if (level == kTraceApiCall) {
      builtin_strncpy(sz_message + 5,"LL   ; ",8);
      uVar1 = 0x204c4c4143495041;
    }
    else if (level == kTraceModuleCall) {
      builtin_strncpy(sz_message + 5,"ECALL; ",8);
      uVar1 = 0x4143454c55444f4d;
    }
    else if (level == kTraceMemory) {
      builtin_strncpy(sz_message + 5,"Y    ; ",8);
      uVar1 = 0x202059524f4d454d;
    }
    else if (level == kTraceTimer) {
      builtin_strncpy(sz_message + 5,"     ; ",8);
      uVar1 = 0x20202052454d4954;
    }
    else if (level == kTraceStream) {
      builtin_strncpy(sz_message + 5,"M    ; ",8);
      uVar1 = 0x20204d4145525453;
    }
    else if (level == kTraceDebug) {
      builtin_strncpy(sz_message + 5,"     ; ",8);
      uVar1 = 0x2020204755424544;
    }
    else {
      if (level != kTraceInfo) {
        if (level == kTraceTerseInfo) {
          builtin_strncpy(sz_message,"            ",0xd);
          return 0xc;
        }
        goto switchD_0018f8a1_caseD_2;
      }
      builtin_strncpy(sz_message + 5,"INFO ; ",8);
      uVar1 = 0x464e494755424544;
    }
  }
  *(undefined8 *)sz_message = uVar1;
  return 0xc;
}

Assistant:

int32_t TraceImpl::AddLevel(char* sz_message, const TraceLevel level) const {
  const int kMessageLength = 12;
  switch (level) {
    case kTraceTerseInfo:
      // Add the appropriate amount of whitespace.
      memset(sz_message, ' ', kMessageLength);
      sz_message[kMessageLength] = '\0';
      break;
    case kTraceStateInfo:
      sprintf(sz_message, "STATEINFO ; ");
      break;
    case kTraceWarning:
      sprintf(sz_message, "WARNING   ; ");
      break;
    case kTraceError:
      sprintf(sz_message, "ERROR     ; ");
      break;
    case kTraceCritical:
      sprintf(sz_message, "CRITICAL  ; ");
      break;
    case kTraceInfo:
      sprintf(sz_message, "DEBUGINFO ; ");
      break;
    case kTraceModuleCall:
      sprintf(sz_message, "MODULECALL; ");
      break;
    case kTraceMemory:
      sprintf(sz_message, "MEMORY    ; ");
      break;
    case kTraceTimer:
      sprintf(sz_message, "TIMER     ; ");
      break;
    case kTraceStream:
      sprintf(sz_message, "STREAM    ; ");
      break;
    case kTraceApiCall:
      sprintf(sz_message, "APICALL   ; ");
      break;
    case kTraceDebug:
      sprintf(sz_message, "DEBUG     ; ");
      break;
    default:
      assert(false);
      return 0;
  }
  // All messages are 12 characters.
  return kMessageLength;
}